

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  bool bVar13;
  
  uVar2 = this->abs_value;
  pcVar11 = *it + this->size;
  pcVar5 = pcVar11;
  if (uVar2 < 100) {
    bVar13 = false;
  }
  else {
    iVar8 = -1;
    uVar10 = 1;
    iVar3 = -2;
    uVar4 = 2;
    uVar7 = uVar2;
    do {
      uVar2 = uVar7 / 100;
      uVar1 = (ulong)(uint)(((int)uVar7 + (int)uVar2 * -100) * 2);
      pcVar5[-1] = internal::basic_data<void>::DIGITS[uVar1 + 1];
      lVar12 = -1;
      if ((int)(uVar10 / 3) * 3 + iVar8 == 0) {
        pcVar5[-2] = this->sep;
        lVar12 = -2;
      }
      pcVar5[lVar12 + -1] = internal::basic_data<void>::DIGITS[uVar1];
      if ((int)(uVar4 / 3) * 3 + iVar3 == 0) {
        pcVar5[lVar12 + -2] = this->sep;
        lVar12 = lVar12 + -2;
      }
      else {
        lVar12 = lVar12 + -1;
      }
      pcVar5 = pcVar5 + lVar12;
      iVar8 = iVar8 + -2;
      uVar9 = (int)uVar10 + 2;
      uVar10 = (ulong)uVar9;
      iVar3 = iVar3 + -2;
      uVar4 = (ulong)((int)uVar4 + 2);
      bVar13 = 9999 < uVar7;
      uVar7 = uVar2;
    } while (bVar13);
    bVar13 = iVar8 + (uVar9 / 3) * 3 == 0;
  }
  if (uVar2 < 10) {
    bVar6 = (byte)uVar2 | 0x30;
  }
  else {
    pcVar5[-1] = internal::basic_data<void>::DIGITS[(uVar2 * 2 & 0xffffffff) + 1];
    lVar12 = -1;
    if (bVar13) {
      pcVar5[-2] = this->sep;
      lVar12 = -2;
    }
    pcVar5 = pcVar5 + lVar12;
    bVar6 = internal::basic_data<void>::DIGITS[uVar2 * 2 & 0x1fffffffe];
  }
  pcVar5[-1] = bVar6;
  *it = pcVar11;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = format_decimal(it, abs_value, size,
                            internal::add_thousands_sep<char_type>(s));
      }